

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

uint8_t * get_wedge_mask_inplace(int wedge_index,int neg,BLOCK_SIZE sb_type)

{
  wedge_code_type *pwVar1;
  uint8_t wsignflip;
  int hoff;
  int woff;
  wedge_code_type *a;
  int bw;
  int bh;
  uint8_t *master;
  BLOCK_SIZE sb_type_local;
  int neg_local;
  int wedge_index_local;
  
  pwVar1 = av1_wedge_params_lookup[sb_type].codebook + wedge_index;
  return (uint8_t *)
         (((long)(int)(neg ^ (uint)av1_wedge_params_lookup[sb_type].signflip[wedge_index]) * 0x6000
           + (ulong)pwVar1->direction * 0x1000 +
           (long)((0x20 - ((int)(pwVar1->y_offset * (uint)block_size_high[sb_type]) >> 3)) * 0x40) +
          0xcb00b0) - (long)((int)(pwVar1->x_offset * (uint)block_size_wide[sb_type]) >> 3));
}

Assistant:

static const uint8_t *get_wedge_mask_inplace(int wedge_index, int neg,
                                             BLOCK_SIZE sb_type) {
  const uint8_t *master;
  const int bh = block_size_high[sb_type];
  const int bw = block_size_wide[sb_type];
  const wedge_code_type *a =
      av1_wedge_params_lookup[sb_type].codebook + wedge_index;
  int woff, hoff;
  const uint8_t wsignflip =
      av1_wedge_params_lookup[sb_type].signflip[wedge_index];

  assert(wedge_index >= 0 && wedge_index < get_wedge_types_lookup(sb_type));
  woff = (a->x_offset * bw) >> 3;
  hoff = (a->y_offset * bh) >> 3;
  master = wedge_mask_obl[neg ^ wsignflip][a->direction] +
           MASK_MASTER_STRIDE * (MASK_MASTER_SIZE / 2 - hoff) +
           MASK_MASTER_SIZE / 2 - woff;
  return master;
}